

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall nonius::standard_reporter::do_configure(standard_reporter *this,configuration *cfg)

{
  bool bVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  ostream *os;
  
  this->n_samples = cfg->samples;
  this->verbose = cfg->verbose;
  bVar1 = cfg->summary;
  this->summary = bVar1;
  this->n_resamples = cfg->resamples;
  if ((bVar1 == false) &&
     ((cfg->params).map.
      super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>_>
      ._M_h._M_element_count != 0)) {
    pbVar2 = std::function<std::basic_ostream<char,_std::char_traits<char>_>_&()>::operator()
                       (&(this->super_reporter).os);
    os = std::operator<<(pbVar2,"parameters\n");
    operator<<(os,&(cfg->params).map);
    return;
  }
  return;
}

Assistant:

void do_configure(configuration& cfg) override {
            n_samples = cfg.samples;
            verbose = cfg.verbose;
            summary = cfg.summary;
            n_resamples = cfg.resamples;
            if(!summary && !cfg.params.map.empty()) report_stream() << "parameters\n" << cfg.params.map;
        }